

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O1

void __thiscall
Eigen::
SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
::solveInPlace<Eigen::Matrix<double,_1,3,0,_1,3>>
          (SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
           *this,MatrixBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *X)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  PointerType pdVar13;
  long lVar14;
  char *__function;
  double *pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long local_b0;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> U;
  long local_38;
  
  if (-1 < (int)*(uint *)(*(long *)this + 8)) {
    iVar1 = *(int *)(X + 8);
    uVar10 = *(uint *)(*(long *)this + 8);
    do {
      lVar5 = *(long *)this;
      iVar2 = *(int *)(*(long *)(lVar5 + 0x38) + (ulong)uVar10 * 4);
      lVar17 = (long)iVar2;
      iVar11 = *(int *)(*(long *)(lVar5 + 0x18) + lVar17 * 4);
      iVar3 = *(int *)(*(long *)(lVar5 + 0x38) + 4 + (ulong)uVar10 * 4);
      pdVar13 = (PointerType)(iVar3 - lVar17);
      iVar12 = (int)pdVar13;
      if (iVar12 == 1) {
        if ((iVar2 < 0) || (lVar6 = *(long *)(X + 8), lVar6 <= lVar17)) {
LAB_001587d0:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x151,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 3>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 3>, Level = 1]"
                       );
        }
        lVar5 = *(long *)(lVar5 + 0x10);
        pdVar15 = (double *)(lVar17 * 8 + *(long *)X);
        lVar16 = 3;
        do {
          *pdVar15 = *pdVar15 / *(double *)(lVar5 + (long)iVar11 * 8);
          pdVar15 = pdVar15 + lVar6;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      else {
        if (*(int *)(*(long *)(lVar5 + 0x18) + 4 + lVar17 * 4) - iVar11 < 0) {
LAB_001587ef:
          __assert_fail("innerStride>=0 && outerStride>=0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Stride.h"
                        ,0x40,
                        "Eigen::Stride<-1, 0>::Stride(Index, Index) [_OuterStrideAtCompileTime = -1, _InnerStrideAtCompileTime = 0]"
                       );
        }
        if (iVar12 < 0 && *(long *)(lVar5 + 0x10) != 0) {
          __function = 
          "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<const Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
          ;
LAB_0015883a:
          __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                        ,0x94,__function);
        }
        if ((iVar2 < 0) || (*(long *)(X + 8) <= lVar17)) goto LAB_001587d0;
        if ((long)iVar1 < 0) goto LAB_001587ef;
        local_b0 = lVar17 * 8 + *(long *)X;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = 3;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = pdVar13;
        if ((iVar12 < 0) && (local_b0 != 0)) {
          __function = 
          "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
          ;
          goto LAB_0015883a;
        }
        U.m_stride.super_Stride<_1,_0>._8_8_ = *(long *)(lVar5 + 0x10) + (long)iVar11 * 8;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = (long)iVar1;
        TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>,2u>
        ::solveInPlace<1,Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                  ((TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>,2u>
                    *)&U.m_stride.super_Stride<_1,_0>.field_0x8,
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    *)&local_b0);
      }
      iVar11 = iVar3;
      if (iVar3 < iVar2) {
        iVar11 = iVar2;
      }
      local_38 = 0;
      do {
        if (iVar2 < iVar3) {
          lVar5 = *(long *)(this + 8);
          lVar6 = *(long *)(lVar5 + 0x10);
          lVar16 = lVar17;
          do {
            iVar12 = *(int *)(lVar6 + lVar16 * 4);
            lVar18 = (long)iVar12;
            iVar4 = *(int *)(lVar6 + 4 + lVar16 * 4);
            if (iVar12 < iVar4) {
              if ((lVar16 < 0) || (lVar7 = *(long *)(X + 8), lVar7 <= lVar16)) goto LAB_001587d0;
              lVar8 = *(long *)(lVar5 + 0x18);
              do {
                lVar18 = lVar18 + 1;
                lVar19 = (long)*(int *)(lVar8 + -4 + lVar18 * 4);
                if ((lVar19 < 0) || (lVar7 <= lVar19)) goto LAB_001587d0;
                lVar14 = *(long *)X + lVar7 * local_38 * 8;
                *(double *)(lVar14 + lVar19 * 8) =
                     *(double *)(lVar14 + lVar19 * 8) -
                     *(double *)(lVar14 + lVar16 * 8) *
                     *(double *)(*(long *)(lVar5 + 0x20) + -8 + lVar18 * 8);
              } while ((lVar18 < iVar4) && (iVar12 != 0x7fffffff));
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != iVar11);
        }
        local_38 = local_38 + 1;
      } while (local_38 != 3);
      bVar9 = 0 < (int)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar9);
  }
  return;
}

Assistant:

void solveInPlace(MatrixBase<Dest> &X) const
  {
    Index nrhs = X.cols();
    Index n = X.rows();
    // Backward solve with U
    for (Index k = m_mapL.nsuper(); k >= 0; k--)
    {
      Index fsupc = m_mapL.supToCol()[k];
      Index lda = m_mapL.colIndexPtr()[fsupc+1] - m_mapL.colIndexPtr()[fsupc]; // leading dimension
      Index nsupc = m_mapL.supToCol()[k+1] - fsupc;
      Index luptr = m_mapL.colIndexPtr()[fsupc];

      if (nsupc == 1)
      {
        for (Index j = 0; j < nrhs; j++)
        {
          X(fsupc, j) /= m_mapL.valuePtr()[luptr];
        }
      }
      else
      {
        Map<const Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > A( &(m_mapL.valuePtr()[luptr]), nsupc, nsupc, OuterStride<>(lda) );
        Map< Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > U (&(X(fsupc,0)), nsupc, nrhs, OuterStride<>(n) );
        U = A.template triangularView<Upper>().solve(U);
      }

      for (Index j = 0; j < nrhs; ++j)
      {
        for (Index jcol = fsupc; jcol < fsupc + nsupc; jcol++)
        {
          typename MatrixUType::InnerIterator it(m_mapU, jcol);
          for ( ; it; ++it)
          {
            Index irow = it.index();
            X(irow, j) -= X(jcol, j) * it.value();
          }
        }
      }
    } // End For U-solve
  }